

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_packed_Test::TestBody(expr_packed_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Var *pVVar3;
  char *message;
  AssertHelper local_240;
  Message local_238 [2];
  VarException *anon_var_0;
  type e;
  undefined1 auStack_1f8 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  allocator<char> local_1c9;
  string local_1c8;
  Var *local_1a8;
  Var *b;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  expr_packed_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a",(allocator<char> *)((long)&b + 7));
  pVVar3 = kratos::Generator::var(pGVar2,&local_198,5,5);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  pGVar2 = local_138;
  local_178 = pVVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"b",&local_1c9);
  pVVar3 = kratos::Generator::var(pGVar2,&local_1c8,5,5);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  local_1a8 = pVVar3;
  (*(pVVar3->super_IRNode)._vptr_IRNode[0x19])(pVVar3,0);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_1f8[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffe09 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_1f8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_1f8);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::Var::operator+(local_178,local_1a8);
    }
    if ((e._7_1_ & 1) != 0) goto LAB_001511ff;
    std::__cxx11::string::operator=
              ((string *)auStack_1f8,
               "Expected: a + b throws an exception of type VarException.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_238);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_240,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x1b0,message);
  testing::internal::AssertHelper::operator=(&local_240,local_238);
  testing::internal::AssertHelper::~AssertHelper(&local_240);
  testing::Message::~Message(local_238);
LAB_001511ff:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_1f8);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(expr, packed) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 5, 5);
    auto &b = mod.var("b", 5, 5);
    b.set_is_packed(false);
    EXPECT_THROW(a + b, VarException);
}